

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

void anurbs::to_json<anurbs::Brep>(json *json,Ref<anurbs::Brep> *ref)

{
  byte bVar1;
  runtime_error *this;
  string local_78;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_58 [2];
  string local_38;
  Ref<anurbs::Brep> *local_18;
  Ref<anurbs::Brep> *ref_local;
  json *json_local;
  
  local_18 = ref;
  ref_local = (Ref<anurbs::Brep> *)json;
  Ref<anurbs::Brep>::key_abi_cxx11_(&local_38,ref);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_38);
  if ((bVar1 & 1) == 0) {
    Ref<anurbs::Brep>::key_abi_cxx11_(&local_78,local_18);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_58,&local_78);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)ref_local,local_58);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(local_58);
    std::__cxx11::string::~string((string *)&local_78);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Entity has no key");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void to_json(nlohmann::json& json, const Ref<TData>& ref)
{
    if (ref.key().empty()) {
        throw std::runtime_error("Entity has no key");
    }
    
    json = ref.key();
}